

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfold.cpp
# Opt level: O0

int __thiscall ncnn::Unfold::load_param(Unfold *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar2;
  
  iVar1 = ParamDict::get(in_RSI,1,0);
  *(int *)(in_RDI + 0xd0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xb,*(int *)(in_RDI + 0xd0));
  *(int *)(in_RDI + 0xd4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,1);
  *(int *)(in_RDI + 0xd8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xc,*(int *)(in_RDI + 0xd8));
  *(int *)(in_RDI + 0xdc) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,1);
  *(int *)(in_RDI + 0xe0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xd,*(int *)(in_RDI + 0xe0));
  *(int *)(in_RDI + 0xe4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,4,0);
  *(int *)(in_RDI + 0xe8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xf,*(int *)(in_RDI + 0xe8));
  *(int *)(in_RDI + 0xec) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xe,*(int *)(in_RDI + 0xe8));
  *(int *)(in_RDI + 0xf0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0x10,*(int *)(in_RDI + 0xf0));
  *(int *)(in_RDI + 0xf4) = iVar1;
  fVar2 = ParamDict::get(in_RSI,0x12,0.0);
  *(float *)(in_RDI + 0xf8) = fVar2;
  return 0;
}

Assistant:

int Unfold::load_param(const ParamDict& pd)
{
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    dilation_w = pd.get(2, 1);
    dilation_h = pd.get(12, dilation_w);
    stride_w = pd.get(3, 1);
    stride_h = pd.get(13, stride_w);
    pad_left = pd.get(4, 0);
    pad_right = pd.get(15, pad_left);
    pad_top = pd.get(14, pad_left);
    pad_bottom = pd.get(16, pad_top);
    pad_value = pd.get(18, 0.f);

    return 0;
}